

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ValidityColumnData::AppendData
          (ValidityColumnData *this,BaseStatistics *stats,ColumnAppendState *state,
          UnifiedVectorFormat *vdata,idx_t count)

{
  mutex *__mutex;
  
  __mutex = &(this->super_ColumnData).stats_lock;
  ::std::mutex::lock(__mutex);
  ColumnData::AppendData(&this->super_ColumnData,stats,state,vdata,count);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void ValidityColumnData::AppendData(BaseStatistics &stats, ColumnAppendState &state, UnifiedVectorFormat &vdata,
                                    idx_t count) {
	lock_guard<mutex> l(stats_lock);
	ColumnData::AppendData(stats, state, vdata, count);
}